

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffgknl(fitsfile *fptr,char *keyname,int nstart,int nmax,int *value,int *nfound,int *status)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  __int32_t **pp_Var6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  int nkeys;
  int tstatus;
  int mkeys;
  char keyindex [8];
  char keyroot [75];
  char svalue [71];
  char comm [73];
  char card [81];
  int local_1c8;
  uint local_1c4;
  long local_1c0;
  int local_1b4;
  long local_1b0;
  int *local_1a8;
  long local_1a0;
  int *local_198;
  char *local_190;
  int local_184;
  char local_180 [8];
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  iVar3 = *status;
  if (iVar3 < 1) {
    *nfound = 0;
    local_178[0] = '\0';
    local_198 = value;
    strncat(local_178,keyname,0x4a);
    sVar5 = strlen(local_178);
    uVar9 = (uint)sVar5;
    if (uVar9 != 0) {
      local_1a8 = nfound;
      if (0 < (int)uVar9) {
        pp_Var6 = __ctype_toupper_loc();
        uVar8 = 0;
        do {
          local_178[uVar8] = (char)(*pp_Var6)[local_178[uVar8]];
          uVar8 = uVar8 + 1;
        } while ((uVar9 & 0x7fffffff) != uVar8);
      }
      ffghps(fptr,&local_1c8,&local_184,status);
      ffmaky(fptr,3,status);
      if (2 < local_1c8) {
        local_190 = local_88 + (int)uVar9;
        local_1a0 = (long)(nstart + nmax + -1);
        local_1b0 = (long)nstart;
        local_1c4 = (uint)CONCAT71((int7)(int3)((uint)nstart >> 8),1);
        iVar3 = 3;
        while( true ) {
          iVar4 = ffgnky(fptr,local_88,status);
          if (0 < iVar4) break;
          iVar4 = strncmp(local_178,local_88,(long)(int)uVar9);
          if (iVar4 == 0) {
            local_180[0] = '\0';
            pcVar7 = strchr(local_88,0x3d);
            if (pcVar7 == (char *)0x0) goto LAB_001b2d7a;
            if (7 < (long)pcVar7 - (long)local_190) {
              *status = 0xcf;
              return 0xcf;
            }
            strncat(local_180,local_190,(long)pcVar7 - (long)local_190);
            local_1b4 = 0;
            iVar4 = ffc2ii(local_180,&local_1c0,&local_1b4);
            if ((0 < iVar4) || (local_1c0 < local_1b0 || local_1a0 < local_1c0)) goto LAB_001b2d7a;
            ffpsvc(local_88,local_128,local_d8,status);
            lVar2 = local_1b0;
            ffc2l(local_128,local_198 + (local_1c0 - local_1b0),status);
            if ((long)*local_1a8 <= local_1c0 - lVar2) {
              *local_1a8 = (int)(local_1c0 - lVar2) + 1;
            }
            if (*status != 0xcc) goto LAB_001b2d7a;
            *status = 0;
            local_1c4 = 0;
            bVar1 = local_1c8 <= iVar3;
            iVar3 = iVar3 + 1;
            if (bVar1) {
              iVar3 = *status;
LAB_001b2ec1:
              if (0 < iVar3) {
                return iVar3;
              }
              *status = 0xcc;
              return 0xcc;
            }
          }
          else {
LAB_001b2d7a:
            bVar1 = local_1c8 <= iVar3;
            iVar3 = iVar3 + 1;
            if (bVar1) {
              iVar3 = *status;
              if ((local_1c4 & 1) != 0) {
                return iVar3;
              }
              goto LAB_001b2ec1;
            }
          }
        }
      }
    }
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffgknl( fitsfile *fptr,     /* I - FITS file pointer                    */
            const char *keyname,      /* I - root name of keywords to read        */
            int  nstart,        /* I - starting index number                */
            int  nmax,          /* I - maximum number of keywords to return */
            int  *value,        /* O - array of keyword values              */
            int  *nfound,       /* O - number of values that were returned  */
            int  *status)       /* IO - error status                        */
/*
  Read (get) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NMAX -1) inclusive.  
  The returned value = 1 if the keyword is true, else = 0 if false.
*/
{
    int nend, lenroot, ii, nkeys, mkeys, tstatus, undefinedval;
    long ival;
    char keyroot[FLEN_KEYWORD], keyindex[8], card[FLEN_CARD];
    char svalue[FLEN_VALUE], comm[FLEN_COMMENT], *equalssign;

    if (*status > 0)
        return(*status);

    *nfound = 0;
    nend = nstart + nmax - 1;

    keyroot[0] = '\0';
    strncat(keyroot, keyname, FLEN_KEYWORD - 1);

    lenroot = strlen(keyroot);
    
    if (lenroot == 0)     /*  root must be at least 1 char long  */
        return(*status);
 
    for (ii=0; ii < lenroot; ii++)           /*  make sure upper case  */
        keyroot[ii] = toupper(keyroot[ii]);

    ffghps(fptr, &nkeys, &mkeys, status);  /*  get the number of keywords  */

    ffmaky(fptr, 3, status);  /* move to 3rd keyword (skip 1st 2 keywords) */

    undefinedval = FALSE;
    for (ii=3; ii <= nkeys; ii++)  
    {
       if (ffgnky(fptr, card, status) > 0)     /*  get next keyword  */
           return(*status);

       if (strncmp(keyroot, card, lenroot) == 0)  /* see if keyword matches */
       {
          keyindex[0] = '\0';
          equalssign = strchr(card, '=');
	  if (equalssign == 0) continue;  /* keyword has no value */

          if (equalssign - card - lenroot > 7)
          {
             return (*status=BAD_KEYCHAR);
          }
          strncat(keyindex, &card[lenroot], equalssign - card  - lenroot);  /*  copy suffix  */

          tstatus = 0;
          if (ffc2ii(keyindex, &ival, &tstatus) <= 0)    /*  test suffix  */
          {
             if (ival <= nend && ival >= nstart)
             {
                ffpsvc(card, svalue, comm, status);   /*  parse the value */
                ffc2l(svalue, &value[ival-nstart], status); /* convert*/
                if (ival - nstart + 1 > *nfound)
                      *nfound = ival - nstart + 1;  /*  max found */ 

                if (*status == VALUE_UNDEFINED)
                {
                    undefinedval = TRUE;
                   *status = 0;  /* reset status to read remaining values */
                }
             }
          }
       }
    }
    if (undefinedval && (*status <= 0) )
        *status = VALUE_UNDEFINED;  /* report at least 1 value undefined */

    return(*status);
}